

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lhash_test.cc
# Opt level: O1

uint32_t anon_unknown.dwarf_799b06::lh_char_call_hash_func(lhash_hash_func func,void *a)

{
  uint32_t uVar1;
  
  uVar1 = (*func)(a);
  return uVar1;
}

Assistant:

static std::unique_ptr<char[]> RandString(void) {
  unsigned len = 1 + (rand() % 3);
  auto ret = std::make_unique<char[]>(len + 1);

  for (unsigned i = 0; i < len; i++) {
    ret[i] = '0' + (rand() & 7);
  }
  ret[len] = 0;

  return ret;
}